

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O1

void __thiscall ncnn::ConvolutionDepthWise::~ConvolutionDepthWise(ConvolutionDepthWise *this)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  pointer ppLVar4;
  pointer ppLVar5;
  long lVar6;
  
  (this->super_Layer)._vptr_Layer = (_func_int **)&PTR__ConvolutionDepthWise_00145d68;
  ppLVar4 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar5 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3)) {
    lVar6 = 0;
    do {
      if (ppLVar4[lVar6] != (Layer *)0x0) {
        (*ppLVar4[lVar6]->_vptr_Layer[1])();
      }
      lVar6 = lVar6 + 1;
      ppLVar4 = (this->quantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppLVar5 = (this->quantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (lVar6 < (int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3));
  }
  if (ppLVar5 != ppLVar4) {
    (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar4;
  }
  ppLVar4 = (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppLVar5 = (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (0 < (int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3)) {
    lVar6 = 0;
    do {
      if (ppLVar4[lVar6] != (Layer *)0x0) {
        (*ppLVar4[lVar6]->_vptr_Layer[1])();
      }
      lVar6 = lVar6 + 1;
      ppLVar4 = (this->dequantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppLVar5 = (this->dequantize_ops).
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    } while (lVar6 < (int)((ulong)((long)ppLVar5 - (long)ppLVar4) >> 3));
  }
  if (ppLVar5 != ppLVar4) {
    (this->dequantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl
    .super__Vector_impl_data._M_finish = ppLVar4;
  }
  if (ppLVar4 != (pointer)0x0) {
    operator_delete(ppLVar4,(long)(this->dequantize_ops).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar4)
    ;
  }
  ppLVar4 = (this->quantize_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppLVar4 != (pointer)0x0) {
    operator_delete(ppLVar4,(long)(this->quantize_ops).
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppLVar4)
    ;
  }
  piVar1 = (this->bottom_blob_int8_scales).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->bottom_blob_int8_scales).data;
      pAVar3 = (this->bottom_blob_int8_scales).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(*(void **)((long)pvVar2 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar3 + 8))();
      }
    }
  }
  (this->bottom_blob_int8_scales).data = (void *)0x0;
  (this->bottom_blob_int8_scales).refcount = (int *)0x0;
  (this->bottom_blob_int8_scales).elemsize = 0;
  (this->bottom_blob_int8_scales).cstep = 0;
  (this->bottom_blob_int8_scales).dims = 0;
  (this->bottom_blob_int8_scales).w = 0;
  (this->bottom_blob_int8_scales).h = 0;
  (this->bottom_blob_int8_scales).c = 0;
  piVar1 = (this->weight_data_int8_scales).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->weight_data_int8_scales).data;
      pAVar3 = (this->weight_data_int8_scales).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(*(void **)((long)pvVar2 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar3 + 8))();
      }
    }
  }
  (this->weight_data_int8_scales).data = (void *)0x0;
  (this->weight_data_int8_scales).refcount = (int *)0x0;
  (this->weight_data_int8_scales).elemsize = 0;
  (this->weight_data_int8_scales).cstep = 0;
  (this->weight_data_int8_scales).dims = 0;
  (this->weight_data_int8_scales).w = 0;
  (this->weight_data_int8_scales).h = 0;
  (this->weight_data_int8_scales).c = 0;
  piVar1 = (this->bias_data).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->bias_data).data;
      pAVar3 = (this->bias_data).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(*(void **)((long)pvVar2 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar3 + 8))();
      }
    }
  }
  (this->bias_data).data = (void *)0x0;
  (this->bias_data).refcount = (int *)0x0;
  (this->bias_data).elemsize = 0;
  (this->bias_data).cstep = 0;
  (this->bias_data).dims = 0;
  (this->bias_data).w = 0;
  (this->bias_data).h = 0;
  (this->bias_data).c = 0;
  piVar1 = (this->weight_data).refcount;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = (this->weight_data).data;
      pAVar3 = (this->weight_data).allocator;
      if (pAVar3 == (Allocator *)0x0) {
        if (pvVar2 != (void *)0x0) {
          free(*(void **)((long)pvVar2 + -8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar3 + 8))();
      }
    }
  }
  (this->weight_data).data = (void *)0x0;
  (this->weight_data).refcount = (int *)0x0;
  (this->weight_data).elemsize = 0;
  (this->weight_data).cstep = 0;
  (this->weight_data).dims = 0;
  (this->weight_data).w = 0;
  (this->weight_data).h = 0;
  (this->weight_data).c = 0;
  Layer::~Layer(&this->super_Layer);
  return;
}

Assistant:

ConvolutionDepthWise::~ConvolutionDepthWise()
{
    for (int i=0; i<(int)quantize_ops.size(); i++)
        delete quantize_ops[i];

    quantize_ops.clear();

    for (int i=0; i<(int)dequantize_ops.size(); i++)
        delete dequantize_ops[i];

    dequantize_ops.clear();
}